

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

result_type time_plain<trng::yarn3s>(yarn3s *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  string res;
  string local_58;
  double local_38;
  
  lVar4 = std::chrono::_V2::system_clock::now();
  iVar1 = (r->P).a[0];
  iVar2 = (r->P).a[1];
  iVar3 = (r->P).a[2];
  uVar11 = (ulong)(uint)(r->S).r[0];
  iVar5 = 0;
  lVar7 = 0x1000000;
  iVar9 = (r->S).r[1];
  iVar8 = (r->S).r[2];
  do {
    iVar6 = iVar9;
    iVar9 = (int)uVar11;
    (r->S).r[2] = iVar6;
    uVar12 = (long)iVar8 * (long)iVar3 + (long)iVar6 * (long)iVar2 + (long)iVar9 * (long)iVar1;
    uVar12 = (uVar12 >> 0x1f) * -0x7fffadb3 + uVar12;
    uVar12 = (uVar12 >> 0x1f) * -0x7fffadb3 + uVar12;
    uVar11 = uVar12 + 0x8000524d;
    if (uVar12 < 0x7fffadb3) {
      uVar11 = uVar12;
    }
    (r->S).r[1] = iVar9;
    iVar10 = (int)uVar11;
    (r->S).r[0] = iVar10;
    iVar8 = 0;
    if (iVar10 != 0) {
      uVar12 = ((ulong)*(uint *)(trng::yarn3s::g + (uVar11 & 0xffff) * 4) *
                (ulong)*(uint *)(trng::yarn3s::g + (long)(iVar10 >> 0x10) * 4 + 0x40000) >> 0x1f) *
               -0x7fffadb3 +
               (ulong)*(uint *)(trng::yarn3s::g + (uVar11 & 0xffff) * 4) *
               (ulong)*(uint *)(trng::yarn3s::g + (long)(iVar10 >> 0x10) * 4 + 0x40000);
      uVar12 = (uVar12 >> 0x1f) * -0x7fffadb3 + uVar12;
      iVar10 = (int)uVar12;
      iVar8 = iVar10 + -0x7fffadb3;
      if (uVar12 < 0x7fffadb3) {
        iVar8 = iVar10;
      }
    }
    iVar5 = iVar5 + iVar8;
    lVar7 = lVar7 + -1;
    iVar8 = iVar6;
  } while (lVar7 != 0);
  lVar7 = std::chrono::_V2::system_clock::now();
  local_38 = 16.777216 / ((double)((lVar7 - lVar4) / 1000) * 1e-06);
  to_string<double>(&local_58,&local_38);
  while (local_58._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_58);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_58._M_dataplus._M_p,local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return iVar5;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}